

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

void __thiscall MeshLib::Solid::readBYU(Solid *this,istream *is)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  double *pdVar6;
  tVertex pVVar7;
  int i;
  long lVar8;
  string str_1;
  int v [3];
  string_token_iterator iter_1;
  string s_1;
  string s;
  string str;
  string_token_iterator iter;
  char line [2048];
  int local_950;
  int local_94c;
  char *local_938;
  undefined8 local_930;
  char local_928 [16];
  Point local_918;
  string_token_iterator local_900;
  string local_8e0;
  double local_8c0;
  string local_8b8;
  undefined1 *local_898 [2];
  undefined1 local_888 [16];
  char *local_878 [2];
  char local_868 [16];
  string_token_iterator local_858;
  char local_838 [2056];
  
  cVar1 = (char)is;
  std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar1);
  std::istream::getline((char *)is,(long)local_838,'\0');
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  sVar4 = strlen(local_838);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,local_838,local_838 + sVar4);
  local_858.separator = " \n";
  local_858.end = 0;
  local_858.str = &local_8b8;
  string_token_iterator::find_next(&local_858);
  string_token_iterator::find_next(&local_858);
  std::__cxx11::string::string
            ((string *)local_878,(string *)local_858.str,local_858.start,
             local_858.end - local_858.start);
  iVar2 = atoi(local_878[0]);
  string_token_iterator::find_next(&local_858);
  std::__cxx11::string::string
            ((string *)&local_8e0,(string *)local_858.str,local_858.start,
             local_858.end - local_858.start);
  std::__cxx11::string::operator=((string *)local_878,(string *)&local_8e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + cVar1);
  std::istream::getline((char *)is,(long)local_838,'\0');
  local_950 = 1;
  local_94c = 1;
  while( true ) {
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 7) != 0) break;
    std::ios::widen((char)*(long *)(*(long *)is + -0x18) + cVar1);
    plVar5 = (long *)std::istream::getline((char *)is,(long)local_838,'\0');
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
    if (local_838[0] != '\0') {
      local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
      sVar4 = strlen(local_838);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8e0,local_838,local_838 + sVar4);
      local_900.separator = " \n";
      local_900.end = 0;
      local_900.str = &local_8e0;
      string_token_iterator::find_next(&local_900);
      local_938 = local_928;
      local_930 = 0;
      local_928[0] = '\0';
      if (iVar2 < local_950) {
        lVar8 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)local_898,(string *)local_900.str,local_900.start,
                     local_900.end - local_900.start);
          std::__cxx11::string::operator=((string *)&local_938,(string *)local_898);
          if (local_898[0] != local_888) {
            operator_delete(local_898[0]);
          }
          iVar3 = atoi(local_938);
          *(int *)((long)local_918.v + lVar8 * 4) = iVar3;
          string_token_iterator::find_next(&local_900);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_918.v[1] = (double)CONCAT44(local_918.v[1]._4_4_,-local_918.v[1]._0_4_);
        createFace(this,(int *)&local_918,local_94c);
        local_94c = local_94c + 1;
      }
      else {
        local_918.v[0] = 0.0;
        local_918.v[1] = 0.0;
        local_918.v[2] = 0.0;
        iVar3 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)local_898,(string *)local_900.str,local_900.start,
                     local_900.end - local_900.start);
          std::__cxx11::string::operator=((string *)&local_938,(string *)local_898);
          if (local_898[0] != local_888) {
            operator_delete(local_898[0]);
          }
          local_8c0 = atof(local_938);
          pdVar6 = Point::operator[](&local_918,iVar3);
          *pdVar6 = local_8c0;
          string_token_iterator::find_next(&local_900);
          iVar3 = iVar3 + 1;
        } while (iVar3 != 3);
        pVVar7 = createVertex(this,local_950);
        (pVVar7->m_point).v[2] = local_918.v[2];
        (pVVar7->m_point).v[0] = local_918.v[0];
        (pVVar7->m_point).v[1] = local_918.v[1];
        pVVar7->m_id = local_950;
        local_950 = local_950 + 1;
      }
      if (local_938 != local_928) {
        operator_delete(local_938);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
        operator_delete(local_8e0._M_dataplus._M_p);
      }
    }
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  if (local_878[0] != local_868) {
    operator_delete(local_878[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Solid::readBYU( std::istream & is )
{
	char line[MAX_LINE];

	is.getline(line, MAX_LINE);
	std::string s(line );
	string_token_iterator iter(s, " \n");
	std::string str = *(++iter);
	int vnum = atoi( str.c_str() );
	str = *(++iter);
//	int fnum = atoi( str.c_str() );
	is.getline(line, MAX_LINE);
	int vind, find;
	vind = find = 1;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		std::string str;

		if( vind <= vnum )
		{
			Point p;
			for( int i=0; i<3; i++ )
			{
				str = *iter;
				p[i] = atof( str.c_str() );
				iter++;
			}

			tVertex v = createVertex( vind );
			v->point() = p;
			v->id() = vind;
			vind ++;
		}
		else
		{
			int v[3];
			for( int i = 0; i < 3; i ++ )
			{
				str = *iter;
				v[i] = atoi( str.c_str() );
				iter++;
			}
			v[2] = -v[2];

			createFace( v, find );
			find ++;
		}
	}

	labelBoundaryEdges();

	removeDanglingVertices();

}